

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging_p.h
# Opt level: O3

void __thiscall
QInternalMessageLogContext::QInternalMessageLogContext
          (QInternalMessageLogContext *this,QMessageLogContext *logContext,
          QLoggingCategory *categoryOverride)

{
  int frameCount;
  
  (this->super_QMessageLogContext).version = 2;
  *(undefined8 *)&(this->super_QMessageLogContext).line = 0;
  *(undefined8 *)((long)&(this->super_QMessageLogContext).file + 4) = 0;
  (this->super_QMessageLogContext).function = (char *)0x0;
  (this->super_QMessageLogContext).category = (char *)0x0;
  (this->backtrace).super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
  super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
  super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged = false;
  frameCount = initFrom(this,logContext);
  if (frameCount != 0) {
    populateBacktrace(this,frameCount);
  }
  (this->super_QMessageLogContext).category = categoryOverride->name;
  return;
}

Assistant:

QInternalMessageLogContext(const QMessageLogContext &logContext,
                               const QLoggingCategory &categoryOverride)
        : QInternalMessageLogContext(logContext)
    {
        category = categoryOverride.categoryName();
    }